

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_ShowFile(char *FileNameDot)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  char local_8f8 [8];
  char CommandPs [1000];
  char *pcStack_500;
  int RetValue;
  char *pGsNameUnix;
  char *pGsNameWin;
  char *pDotNameUnix;
  char *pDotNameWin;
  char *pDotName;
  char CommandDot [1000];
  char local_e8 [8];
  char FileNamePs [200];
  char *FileGeneric;
  FILE *pFile;
  char *FileNameDot_local;
  
  pGsNameWin = "dot";
  pcStack_500 = "gv";
  pcVar2 = Abc_FrameReadFlag("dotwin");
  if (pcVar2 != (char *)0x0) {
    Abc_FrameReadFlag("dotwin");
  }
  pcVar2 = Abc_FrameReadFlag("dotunix");
  if (pcVar2 != (char *)0x0) {
    pGsNameWin = Abc_FrameReadFlag("dotunix");
  }
  pFVar3 = fopen(FileNameDot,"r");
  if (pFVar3 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
  }
  else {
    fclose(pFVar3);
    FileNamePs._192_8_ = Extra_FileNameGeneric(FileNameDot);
    sprintf(local_e8,"%s.ps",FileNamePs._192_8_);
    if (FileNamePs._192_8_ != 0) {
      free((void *)FileNamePs._192_8_);
      FileNamePs[0xc0] = '\0';
      FileNamePs[0xc1] = '\0';
      FileNamePs[0xc2] = '\0';
      FileNamePs[0xc3] = '\0';
      FileNamePs[0xc4] = '\0';
      FileNamePs[0xc5] = '\0';
      FileNamePs[0xc6] = '\0';
      FileNamePs[199] = '\0';
    }
    sprintf((char *)&pDotName,"%s -Tps -o %s %s",pGsNameWin,local_e8,FileNameDot);
    iVar1 = system((char *)&pDotName);
    if (iVar1 == -1) {
      fprintf(_stdout,"Command \"%s\" did not succeed.\n",&pDotName);
    }
    else {
      pFVar3 = fopen(local_e8,"r");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open intermediate file \"%s\".\n",local_e8);
      }
      else {
        fclose(pFVar3);
        pcVar2 = Abc_FrameReadFlag("gsviewwin");
        if (pcVar2 != (char *)0x0) {
          Abc_FrameReadFlag("gsviewwin");
        }
        pcVar2 = Abc_FrameReadFlag("gsviewunix");
        if (pcVar2 != (char *)0x0) {
          pcStack_500 = Abc_FrameReadFlag("gsviewunix");
        }
        unlink(FileNameDot);
        sprintf(local_8f8,"%s %s &",pcStack_500,local_e8);
        iVar1 = system(local_8f8);
        if (iVar1 == -1) {
          fprintf(_stdout,"Cannot execute \"%s\".\n",local_8f8);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_ShowFile( char * FileNameDot )
{
    FILE * pFile;
    char * FileGeneric;
    char FileNamePs[200];
    char CommandDot[1000];
    char * pDotName;
    char * pDotNameWin = "dot.exe";
    char * pDotNameUnix = "dot";
    char * pGsNameWin = "gsview32.exe";
    char * pGsNameUnix = "gv";
    int RetValue;

    // get DOT names from the resource file
    if ( Abc_FrameReadFlag("dotwin") )
        pDotNameWin = Abc_FrameReadFlag("dotwin");
    if ( Abc_FrameReadFlag("dotunix") )
        pDotNameUnix = Abc_FrameReadFlag("dotunix");

#ifdef WIN32
    pDotName = pDotNameWin;
#else
    pDotName = pDotNameUnix;
#endif

    // check if the input DOT file is okay
    if ( (pFile = fopen( FileNameDot, "r" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );

    // create the PostScript file name
    FileGeneric = Extra_FileNameGeneric( FileNameDot );
    sprintf( FileNamePs,  "%s.ps",  FileGeneric ); 
    ABC_FREE( FileGeneric );

    // generate the PostScript file using DOT
    sprintf( CommandDot,  "%s -Tps -o %s %s", pDotName, FileNamePs, FileNameDot ); 
    RetValue = system( CommandDot );
    if ( RetValue == -1 )
    {
        fprintf( stdout, "Command \"%s\" did not succeed.\n", CommandDot );
        return;
    }
    // check that the input PostScript file is okay
    if ( (pFile = fopen( FileNamePs, "r" )) == NULL )
    {
        fprintf( stdout, "Cannot open intermediate file \"%s\".\n", FileNamePs );
        return;
    }
    fclose( pFile ); 


    // get GSVIEW names from the resource file
    if ( Abc_FrameReadFlag("gsviewwin") )
        pGsNameWin = Abc_FrameReadFlag("gsviewwin");
    if ( Abc_FrameReadFlag("gsviewunix") )
        pGsNameUnix = Abc_FrameReadFlag("gsviewunix");

    // spawn the viewer
#ifdef WIN32
    _unlink( FileNameDot );
    if ( _spawnl( _P_NOWAIT, pGsNameWin, pGsNameWin, FileNamePs, NULL ) == -1 )
        if ( _spawnl( _P_NOWAIT, "C:\\Program Files\\Ghostgum\\gsview\\gsview32.exe", 
            "C:\\Program Files\\Ghostgum\\gsview\\gsview32.exe", FileNamePs, NULL ) == -1 )
			if ( _spawnl( _P_NOWAIT, "C:\\Program Files\\Ghostgum\\gsview\\gsview64.exe", 
				"C:\\Program Files\\Ghostgum\\gsview\\gsview64.exe", FileNamePs, NULL ) == -1 )
			{
				fprintf( stdout, "Cannot find \"%s\".\n", pGsNameWin );
				return;
			}
#else
    {
        char CommandPs[1000];
        unlink( FileNameDot );
        sprintf( CommandPs,  "%s %s &", pGsNameUnix, FileNamePs ); 
        if ( system( CommandPs ) == -1 )
        {
            fprintf( stdout, "Cannot execute \"%s\".\n", CommandPs );
            return;
        }
    }
#endif
}